

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

string * __thiscall
libcellml::Variable::VariableImpl::equivalentMappingId_abi_cxx11_
          (string *__return_storage_ptr__,VariableImpl *this,VariablePtr *equivalentVariable)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  key_type kStack_38;
  
  std::__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<libcellml::Variable,void>
            ((__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2> *)&kStack_38,
             &equivalentVariable->
              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  cVar1 = std::
          _Rb_tree<std::weak_ptr<libcellml::Variable>,_std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->mMappingIdMap)._M_t,&kStack_38);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&kStack_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->mMappingIdMap)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&kStack_38);
  }
  else {
    std::__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libcellml::Variable,void>
              ((__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2> *)&kStack_38,
               &equivalentVariable->
                super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
    pmVar2 = std::
             map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&this->mMappingIdMap,&kStack_38);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&kStack_38.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::VariableImpl::equivalentMappingId(const VariablePtr &equivalentVariable) const
{
    if (mMappingIdMap.find(equivalentVariable) != mMappingIdMap.end()) {
        return mMappingIdMap.at(equivalentVariable);
    }
    return "";
}